

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_exception.h
# Opt level: O1

void __thiscall L15_3::BadMeanArgumentException::msg(BadMeanArgumentException *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mean argument(",0xe);
  poVar1 = std::ostream::_M_insert<double>(this->_a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(this->_b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") invalid.\n",0xb);
  return;
}

Assistant:

inline void BadMeanArgumentException::msg() const {
        std::cout << "Mean argument(" << _a << ", " << _b << ") invalid.\n";
    }